

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O0

char * cmd_reg(skynet_context *context,char *param)

{
  char *param_local;
  skynet_context *context_local;
  
  if ((param == (char *)0x0) || (*param == '\0')) {
    sprintf(context->result,":%x",(ulong)context->handle);
    context_local = (skynet_context *)context->result;
  }
  else if (*param == '.') {
    context_local = (skynet_context *)skynet_handle_namehandle(context->handle,param + 1);
  }
  else {
    skynet_error(context,"Can\'t register global name %s in C",param);
    context_local = (skynet_context *)0x0;
  }
  return (char *)context_local;
}

Assistant:

static const char *
cmd_reg(struct skynet_context * context, const char * param) {
	if (param == NULL || param[0] == '\0') {
		sprintf(context->result, ":%x", context->handle);
		return context->result;
	} else if (param[0] == '.') {
		return skynet_handle_namehandle(context->handle, param + 1);
	} else {
		skynet_error(context, "Can't register global name %s in C", param);
		return NULL;
	}
}